

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

void __thiscall libtorrent::session::session(session *this)

{
  session_params params;
  session_params sStack_1d8;
  
  (this->m_impl).super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_impl).super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_io_service).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_io_service).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_session_handle).m_impl.
  super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_session_handle).m_impl.
  super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  session_params::session_params(&sStack_1d8);
  start(this,sStack_1d8.flags,&sStack_1d8,(io_context *)0x0);
  session_params::~session_params(&sStack_1d8);
  return;
}

Assistant:

session::session()
	{
		session_params params;
		start(params.flags, std::move(params), nullptr);
	}